

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

Curl_addrinfo * Curl_resolver_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  undefined1 *puVar1;
  anon_enum_32 aVar2;
  Curl_easy *data;
  time_t *ptVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  undefined8 *puVar7;
  pthread_mutex_t *__mutex;
  char *pcVar8;
  pthread_t *ppVar9;
  int *piVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Curl_async *async;
  int iVar13;
  curltime cVar14;
  
  data = conn->data;
  ptVar3 = (time_t *)(data->state).resolver;
  *waitp = 0;
  if (conn->ip_version == 1) {
    bVar4 = true;
    uVar12 = 2;
  }
  else if (conn->ip_version == 2) {
    uVar12 = 10;
    bVar4 = false;
  }
  else {
    bVar4 = false;
    uVar12 = 0;
  }
  uVar11 = 2;
  if (!bVar4) {
    _Var5 = Curl_ipv6works(conn);
    uVar11 = 2;
    if (_Var5) {
      uVar11 = uVar12;
    }
  }
  aVar2 = conn->transport;
  cVar14 = Curl_now();
  *ptVar3 = cVar14.tv_sec;
  *(int *)(ptVar3 + 1) = cVar14.tv_usec;
  puVar7 = (undefined8 *)(*Curl_ccalloc)(1,0x90);
  (conn->async).os_specific = puVar7;
  iVar13 = 0xc;
  if (puVar7 != (undefined8 *)0x0) {
    (conn->async).port = port;
    puVar1 = &(conn->async).field_0x28;
    *puVar1 = *puVar1 & 0xfe;
    (conn->async).status = 0;
    (conn->async).dns = (Curl_dns_entry *)0x0;
    *puVar7 = 0;
    puVar7[5] = 0;
    puVar7[6] = 0;
    puVar7[3] = 0;
    puVar7[4] = 0;
    puVar7[0xb] = 0;
    puVar7[0xc] = 0;
    puVar7[0xd] = 0;
    puVar7[0xe] = 0;
    puVar7[0xf] = 0;
    puVar7[0x10] = 0;
    puVar7[7] = 0;
    puVar7[8] = 0;
    puVar7[9] = 0;
    puVar7[10] = 0;
    puVar7[0x11] = puVar7;
    *(int *)(puVar7 + 6) = port;
    *(undefined4 *)(puVar7 + 4) = 1;
    *(undefined4 *)(puVar7 + 0xb) = 0;
    *(undefined4 *)((long)puVar7 + 0x5c) = uVar11;
    *(uint *)(puVar7 + 0xc) = (aVar2 != TRNSPRT_TCP) + 1;
    *(undefined8 *)((long)puVar7 + 100) = 0;
    *(undefined8 *)((long)puVar7 + 0x6c) = 0;
    *(undefined8 *)((long)puVar7 + 0x74) = 0;
    *(undefined8 *)((long)puVar7 + 0x7c) = 0;
    *(undefined4 *)((long)puVar7 + 0x84) = 0;
    __mutex = (pthread_mutex_t *)(*Curl_cmalloc)(0x28);
    puVar7[3] = __mutex;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      iVar6 = Curl_socketpair(1,1,0,(curl_socket_t *)(puVar7 + 8));
      if (iVar6 < 0) {
        puVar7[8] = 0xffffffffffffffff;
      }
      else {
        *(undefined4 *)(puVar7 + 9) = 0;
        pcVar8 = (*Curl_cstrdup)(hostname);
        puVar7[5] = pcVar8;
        if (pcVar8 != (char *)0x0) {
          async = &conn->async;
          (*Curl_cfree)(async->hostname);
          pcVar8 = (*Curl_cstrdup)(hostname);
          async->hostname = pcVar8;
          if (pcVar8 == (char *)0x0) {
            iVar13 = 0xc;
          }
          else {
            *(undefined4 *)(puVar7 + 4) = 0;
            ppVar9 = Curl_thread_create(getaddrinfo_thread,(thread_sync_data *)(puVar7 + 3));
            *puVar7 = ppVar9;
            if (ppVar9 != (pthread_t *)0x0) {
              *waitp = 1;
              return (Curl_addrinfo *)0x0;
            }
            *(undefined4 *)(puVar7 + 4) = 1;
            piVar10 = __errno_location();
            iVar13 = *piVar10;
          }
          destroy_async_data(async);
          goto LAB_0010cbcf;
        }
      }
    }
    destroy_thread_sync_data((thread_sync_data *)(puVar7 + 3));
    (conn->async).os_specific = (void *)0x0;
    (*Curl_cfree)(puVar7);
  }
LAB_0010cbcf:
  piVar10 = __errno_location();
  *piVar10 = iVar13;
  Curl_failf(data,"getaddrinfo() thread failed to start\n");
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_resolver_getaddrinfo(struct connectdata *conn,
                                                const char *hostname,
                                                int port,
                                                int *waitp)
{
  struct addrinfo hints;
  int pf = PF_INET;
  struct Curl_easy *data = conn->data;
  struct resdata *reslv = (struct resdata *)data->state.resolver;

  *waitp = 0; /* default to synchronous response */

#ifdef CURLRES_IPV6
  /*
   * Check if a limited name resolve has been requested.
   */
  switch(conn->ip_version) {
  case CURL_IPRESOLVE_V4:
    pf = PF_INET;
    break;
  case CURL_IPRESOLVE_V6:
    pf = PF_INET6;
    break;
  default:
    pf = PF_UNSPEC;
    break;
  }

  if((pf != PF_INET) && !Curl_ipv6works(conn))
    /* The stack seems to be a non-IPv6 one */
    pf = PF_INET;
#endif /* CURLRES_IPV6 */

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = (conn->transport == TRNSPRT_TCP)?
    SOCK_STREAM : SOCK_DGRAM;

  reslv->start = Curl_now();
  /* fire up a new resolver thread! */
  if(init_resolve_thread(conn, hostname, port, &hints)) {
    *waitp = 1; /* expect asynchronous response */
    return NULL;
  }

  failf(data, "getaddrinfo() thread failed to start\n");
  return NULL;

}